

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O0

ALLEGRO_SAMPLE * al_load_sample_f(ALLEGRO_FILE *fp,char *ident)

{
  ACODEC_TABLE *pAVar1;
  ulong uVar2;
  char *in_RSI;
  ALLEGRO_FILE *in_RDI;
  ACODEC_TABLE *ent;
  ALLEGRO_SAMPLE *local_8;
  
  pAVar1 = find_acodec_table_entry(in_RSI);
  if ((pAVar1 == (ACODEC_TABLE *)0x0) ||
     (pAVar1->fs_loader == (_func_ALLEGRO_SAMPLE_ptr_ALLEGRO_FILE_ptr *)0x0)) {
    uVar2 = _al_trace_prefix(__al_debug_channel,3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio_io.c"
                             ,0x123,"al_load_sample_f");
    if ((uVar2 & 1) != 0) {
      _al_trace_suffix("No handler for audio file extension %s.\n",in_RSI);
    }
    local_8 = (ALLEGRO_SAMPLE *)0x0;
  }
  else {
    local_8 = (*pAVar1->fs_loader)(in_RDI);
  }
  return local_8;
}

Assistant:

ALLEGRO_SAMPLE *al_load_sample_f(ALLEGRO_FILE* fp, const char *ident)
{
   ACODEC_TABLE *ent;

   ASSERT(fp);
   ASSERT(ident);

   ent = find_acodec_table_entry(ident);
   if (ent && ent->fs_loader) {
      return (ent->fs_loader)(fp);
   }
   else {
      ALLEGRO_ERROR("No handler for audio file extension %s.\n", ident);
   }

   return NULL;
}